

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

void __thiscall kratos::DPIFunctionStmtBlock::~DPIFunctionStmtBlock(DPIFunctionStmtBlock *this)

{
  FunctionStmtBlock::~FunctionStmtBlock(&this->super_FunctionStmtBlock);
  operator_delete(this,0x188);
  return;
}

Assistant:

DPIFunctionStmtBlock(Generator *parent, const std::string &function_name)
        : FunctionStmtBlock(parent, function_name) {}